

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

VmConstant * CreateConstantZero(Allocator *allocator,SynBase *source,VmType type)

{
  uint uVar1;
  VmConstant *pVVar2;
  VmValueType VVar3;
  
  VVar3 = type.type;
  uVar1 = type.size;
  if ((VVar3 == VM_TYPE_INT) && (uVar1 == 4)) {
    pVVar2 = CreateConstantInt(allocator,source,0);
    return pVVar2;
  }
  if ((VVar3 == VM_TYPE_DOUBLE) && (uVar1 == 8)) {
    pVVar2 = CreateConstantDouble(allocator,source,0.0);
    return pVVar2;
  }
  if ((VVar3 == VM_TYPE_LONG) && (uVar1 == 8)) {
    pVVar2 = CreateConstantLong(allocator,source,0);
    return pVVar2;
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0xa2,"VmConstant *CreateConstantZero(Allocator *, SynBase *, VmType)");
}

Assistant:

VmConstant* CreateConstantZero(Allocator *allocator, SynBase *source, VmType type)
{
	if(type == VmType::Int)
		return CreateConstantInt(allocator, source, 0);

	if(type == VmType::Double)
		return CreateConstantDouble(allocator, source, 0);

	if(type == VmType::Long)
		return CreateConstantLong(allocator, source, 0);

	assert(!"unknown type");
	return NULL;
}